

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O3

void __thiscall ipx::IPM::Predictor(IPM *this,Step *step)

{
  Iterate *pIVar1;
  pointer pSVar2;
  Iterate *this_00;
  double *rb;
  double *rc;
  double *rl;
  double *sl;
  double *su;
  Vector *pVVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  pIVar1 = this->iterate_;
  uVar6 = (long)pIVar1->model_->num_cols_ + (long)pIVar1->model_->num_rows_;
  uVar5 = uVar6 * 8;
  sl = (double *)operator_new(uVar5);
  memset(sl,0,uVar5);
  if (0 < (int)uVar6) {
    pSVar2 = (this->iterate_->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      dVar7 = 0.0;
      if ((pSVar2[uVar4] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar7 = -(pIVar1->xl_)._M_data[uVar4] * (pIVar1->zl_)._M_data[uVar4];
      }
      sl[uVar4] = dVar7;
      uVar4 = uVar4 + 1;
    } while ((uVar6 & 0xffffffff) != uVar4);
  }
  su = (double *)operator_new(uVar5);
  memset(su,0,uVar5);
  this_00 = this->iterate_;
  if (0 < (int)uVar6) {
    pSVar2 = (this_00->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      dVar7 = 0.0;
      if (pSVar2[uVar5] - BARRIER_UB < 2) {
        dVar7 = -(pIVar1->xu_)._M_data[uVar5] * (pIVar1->zu_)._M_data[uVar5];
      }
      su[uVar5] = dVar7;
      uVar5 = uVar5 + 1;
    } while ((uVar6 & 0xffffffff) != uVar5);
  }
  pVVar3 = Iterate::rb(this_00);
  rb = pVVar3->_M_data;
  pVVar3 = Iterate::rc(this->iterate_);
  rc = pVVar3->_M_data;
  pVVar3 = Iterate::rl(this->iterate_);
  rl = pVVar3->_M_data;
  pVVar3 = Iterate::ru(this->iterate_);
  SolveNewtonSystem(this,rb,rc,rl,pVVar3->_M_data,sl,su,step);
  operator_delete(su);
  operator_delete(sl);
  return;
}

Assistant:

void IPM::Predictor(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();

    // sl = -xl.*zl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}